

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  bool bVar1;
  Types TVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  SPIRType *pSVar6;
  Variant *this_00;
  size_t sVar7;
  CompilerError *pCVar8;
  char *pcVar9;
  TypedID *pTVar10;
  SPIRVariable *var_00;
  SPIRType *local_900;
  bool local_842;
  bool local_841;
  string local_838;
  string local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  uint local_7b8;
  uint local_7b4;
  uint32_t i_6;
  uint32_t array_size_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  string local_770;
  undefined1 local_74c [8];
  AccessChainMeta meta_6;
  uint32_t indices_6 [2];
  uint32_t i_5;
  uint32_t num_control_points_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  string local_6f0;
  string local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  uint local_66c;
  undefined1 local_668 [4];
  uint32_t i_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  string local_628;
  undefined1 local_608 [8];
  AccessChainMeta meta_5;
  uint32_t indices_5 [2];
  uint32_t j_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  uint local_5ac;
  SPIRType *pSStack_5a8;
  uint32_t i_3;
  SPIRType *matrix_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  uint32_t local_55c;
  uint32_t local_558;
  uint32_t num_control_points_3;
  uint32_t base_interface_index_1;
  bool is_array_of_matrix;
  string local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0;
  undefined1 local_4ac [8];
  AccessChainMeta meta_4;
  uint32_t indices_4 [2];
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  string local_418;
  undefined1 local_3f4 [8];
  AccessChainMeta meta_3;
  uint32_t indices_3 [2];
  uint32_t k_1;
  uint32_t array_size_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  undefined1 local_2f8 [8];
  AccessChainMeta meta_2;
  uint32_t indices_2 [2];
  uint32_t k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  SPIRType *local_2a0;
  SPIRType *expr_mbr_type;
  SPIRType *mbr_type;
  undefined1 local_288 [4];
  uint32_t j_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  uint local_244;
  SPIRType *pSStack_240;
  uint32_t i_2;
  SPIRType *struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  uint32_t local_1f8;
  byte local_1f1;
  uint32_t num_control_points_2;
  bool is_array_of_struct;
  undefined1 local_1cc [8];
  AccessChainMeta meta_1;
  uint32_t indices_1 [2];
  uint32_t j;
  uint32_t array_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  uint local_16c;
  SPIRType *pSStack_168;
  uint32_t i_1;
  SPIRType *sub_type;
  uint32_t base_interface_index;
  uint32_t num_control_points_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  undefined1 local_f4 [8];
  AccessChainMeta meta;
  uint32_t indices [2];
  uint32_t i;
  uint32_t num_control_points;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined4 local_94;
  SPIRType *local_90;
  SPIRType *iface_type;
  SPIRType *expr_type;
  SPIRVariable *var;
  uint32_t local_64;
  undefined1 local_60 [4];
  uint32_t interface_index;
  string expr;
  bool flat_data_type;
  bool flattened_io;
  bool ptr_is_io_variable;
  SPIRType *result_type;
  SPIRType *ptr_type;
  uint32_t ptr_local;
  uint32_t id_local;
  uint32_t result_type_id_local;
  CompilerMSL *this_local;
  
  pSVar6 = Compiler::expression_type((Compiler *)this,ptr);
  local_900 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type_id);
  if ((pSVar6->storage != StorageClassInput) && (pSVar6->storage != StorageClassOutput)) {
    return false;
  }
  if ((pSVar6->storage == StorageClassOutput) && (bVar1 = is_tese_shader(this), bVar1)) {
    return false;
  }
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)((long)&expr.field_2 + 0xc),ptr);
  bVar1 = Compiler::has_decoration((Compiler *)this,(ID)expr.field_2._12_4_,DecorationPatch);
  if (bVar1) {
    return false;
  }
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>,(ulong)ptr);
  TVar2 = Variant::get_type(this_00);
  expr.field_2._M_local_buf[0xb] = TVar2 == TypeVariable;
  expr.field_2._M_local_buf[10] = variable_storage_requires_stage_io(this,pSVar6->storage);
  local_841 = false;
  if ((bool)expr.field_2._M_local_buf[10]) {
    bVar1 = Compiler::is_matrix((Compiler *)this,local_900);
    local_842 = true;
    if (!bVar1) {
      bVar1 = Compiler::is_array((Compiler *)this,local_900);
      local_842 = true;
      if (!bVar1) {
        local_842 = local_900->basetype == Struct;
      }
    }
    local_841 = local_842;
  }
  expr.field_2._M_local_buf[9] = local_841;
  if (((expr.field_2._M_local_buf[0xb] & 1U) != 0) &&
     (bVar1 = Compiler::is_array((Compiler *)this,local_900), bVar1)) {
    expr.field_2._M_local_buf[9] = '\x01';
  }
  if ((expr.field_2._M_local_buf[9] & 1U) == 0) {
    return false;
  }
  ::std::__cxx11::string::string((string *)local_60);
  local_64 = Compiler::get_extended_decoration
                       ((Compiler *)this,ptr,SPIRVCrossDecorationInterfaceMemberIndex);
  expr_type = (SPIRType *)Compiler::maybe_get_backing_variable((Compiler *)this,ptr);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
  iface_type = Compiler::get_pointee_type((Compiler *)this,uVar3);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
  local_90 = Compiler::expression_type((Compiler *)this,uVar3);
  if ((expr.field_2._M_local_buf[10] & 1U) == 0) {
    if (local_64 == 0xffffffff) {
      this_local._7_1_ = false;
      goto LAB_00287132;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&i,this,local_900,0);
    ::std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,"({ ");
    ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_b8);
    ::std::__cxx11::string::~string((string *)&local_b8);
    ::std::__cxx11::string::~string((string *)&i);
    sVar7 = VectorView<unsigned_int>::size(&(local_900->array).super_VectorView<unsigned_int>);
    uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_900,(int)sVar7 - 1);
    for (indices[0] = 0; indices[0] < uVar3; indices[0] = indices[0] + 1) {
      meta.need_transpose = (bool)(undefined1)indices[0];
      meta.storage_is_packed = (bool)indices[0]._1_1_;
      meta.storage_is_invariant = (bool)indices[0]._2_1_;
      meta.flattened_struct = (bool)indices[0]._3_1_;
      meta.relaxed_precision = (bool)(undefined1)local_64;
      meta.access_meshlet_position_y = (bool)local_64._1_1_;
      meta._10_2_ = local_64._2_2_;
      AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_f4);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
      CompilerGLSL::access_chain_internal_abi_cxx11_
                (&local_118,&this->super_CompilerGLSL,uVar4,(uint32_t *)&meta.need_transpose,2,5,
                 (AccessChainMeta *)local_f4);
      ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_118);
      ::std::__cxx11::string::~string((string *)&local_118);
      if (indices[0] + 1 < uVar3) {
        ::std::__cxx11::string::operator+=((string *)local_60,", ");
      }
    }
    ::std::__cxx11::string::operator+=((string *)local_60," })");
  }
  else {
    sVar7 = VectorView<unsigned_int>::size(&(local_900->array).super_VectorView<unsigned_int>);
    if (2 < sVar7) {
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar8,"Cannot load tessellation IO variables with more than 2 dimensions.");
      __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    sVar7 = VectorView<unsigned_int>::size(&(local_900->array).super_VectorView<unsigned_int>);
    if (sVar7 == 2) {
      if ((expr.field_2._M_local_buf[0xb] & 1U) == 0) {
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar8,"Loading an array-of-array must be loaded directly from an IO variable.");
        __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_64 == 0xffffffff) {
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar8,"Interface index is unknown. Cannot continue.");
        __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((local_900->basetype == Struct) ||
         (bVar1 = Compiler::is_matrix((Compiler *)this,local_900), bVar1)) {
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar8,"Cannot load array-of-array of composite type in tessellation IO.");
        __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&base_interface_index,this,local_900,0);
      ::std::operator+(&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &base_interface_index,"({ ");
      ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_138);
      ::std::__cxx11::string::~string((string *)&local_138);
      ::std::__cxx11::string::~string((string *)&base_interface_index);
      sub_type._4_4_ = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_900,1);
      sub_type._0_4_ = local_64;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_900->parent_type);
      pSStack_168 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      for (local_16c = 0; local_16c < sub_type._4_4_; local_16c = local_16c + 1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&j,this,pSStack_168,0);
        ::std::operator+(&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j,
                         "({ ");
        ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_190);
        ::std::__cxx11::string::~string((string *)&local_190);
        ::std::__cxx11::string::~string((string *)&j);
        local_64 = (uint32_t)sub_type;
        uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_900,0);
        for (indices_1[0] = 0; indices_1[0] < uVar3; indices_1[0] = indices_1[0] + 1) {
          meta_1.need_transpose = (bool)(undefined1)local_16c;
          meta_1.storage_is_packed = (bool)local_16c._1_1_;
          meta_1.storage_is_invariant = (bool)local_16c._2_1_;
          meta_1.flattened_struct = (bool)local_16c._3_1_;
          meta_1.relaxed_precision = (bool)(undefined1)local_64;
          meta_1.access_meshlet_position_y = (bool)local_64._1_1_;
          meta_1._10_2_ = local_64._2_2_;
          AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_1cc);
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
          CompilerGLSL::access_chain_internal_abi_cxx11_
                    ((string *)&num_control_points_2,&this->super_CompilerGLSL,uVar4,
                     (uint32_t *)&meta_1.need_transpose,2,5,(AccessChainMeta *)local_1cc);
          ::std::__cxx11::string::operator+=((string *)local_60,(string *)&num_control_points_2);
          ::std::__cxx11::string::~string((string *)&num_control_points_2);
          bVar1 = Compiler::is_matrix((Compiler *)this,pSStack_168);
          if (((!bVar1) && (pSStack_168->basetype != Struct)) &&
             (pSStack_168->vecsize < iface_type->vecsize)) {
            pcVar9 = CompilerGLSL::vector_swizzle(pSStack_168->vecsize,0);
            ::std::__cxx11::string::operator+=((string *)local_60,pcVar9);
          }
          if (indices_1[0] + 1 < uVar3) {
            ::std::__cxx11::string::operator+=((string *)local_60,", ");
          }
          local_64 = local_64 + 1;
        }
        ::std::__cxx11::string::operator+=((string *)local_60," })");
        if (local_16c + 1 < sub_type._4_4_) {
          ::std::__cxx11::string::operator+=((string *)local_60,", ");
        }
      }
      ::std::__cxx11::string::operator+=((string *)local_60," })");
    }
    else if (local_900->basetype == Struct) {
      local_1f1 = Compiler::is_array((Compiler *)this,local_900);
      if (((bool)local_1f1) && ((expr.field_2._M_local_buf[0xb] & 1U) == 0)) {
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar8,
                   "Loading array of struct from IO variable must come directly from IO variable.");
        __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_1f8 = 1;
      if ((bool)local_1f1) {
        local_1f8 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_900,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&struct_type,this,local_900,0);
        ::std::operator+(&local_218,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &struct_type,"({ ");
        ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_218);
        ::std::__cxx11::string::~string((string *)&local_218);
        ::std::__cxx11::string::~string((string *)&struct_type);
      }
      if ((local_1f1 & 1) != 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_900->parent_type);
        local_900 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      }
      pSStack_240 = local_900;
      bVar1 = VectorView<unsigned_int>::empty(&(local_900->array).super_VectorView<unsigned_int>);
      if (!bVar1) {
        __assert_fail("struct_type.array.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                      ,0x1f75,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                     );
      }
      for (local_244 = 0; local_244 < local_1f8; local_244 = local_244 + 1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_288,this,pSStack_240,0);
        ::std::operator+(&local_268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288,"{ ");
        ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_268);
        ::std::__cxx11::string::~string((string *)&local_268);
        ::std::__cxx11::string::~string((string *)local_288);
        for (mbr_type._4_4_ = 0; uVar5 = mbr_type._4_4_,
            sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                              (&(pSStack_240->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
            uVar5 < (uint)sVar7; mbr_type._4_4_ = mbr_type._4_4_ + 1) {
          if (expr_type != (SPIRType *)0x0) {
            uVar3 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(expr_type->super_IVariant).self);
            local_64 = Compiler::get_extended_member_decoration
                                 ((Compiler *)this,uVar3,mbr_type._4_4_,
                                  SPIRVCrossDecorationInterfaceMemberIndex);
          }
          if (local_64 == 0xffffffff) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar8,"Interface index is unknown. Cannot continue.");
            __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          pTVar10 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (&(pSStack_240->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                               (ulong)mbr_type._4_4_);
          uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar10);
          expr_mbr_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
          pTVar10 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (&(iface_type->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                               (ulong)mbr_type._4_4_);
          uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar10);
          local_2a0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
          bVar1 = Compiler::is_matrix((Compiler *)this,expr_mbr_type);
          if ((bVar1) && (pSVar6->storage == StorageClassInput)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (indices_2 + 1,this,expr_mbr_type,0);
            ::std::operator+(&local_2c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (indices_2 + 1),"(");
            ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_2c0);
            ::std::__cxx11::string::~string((string *)&local_2c0);
            ::std::__cxx11::string::~string((string *)(indices_2 + 1));
            for (indices_2[0] = 0; indices_2[0] < expr_mbr_type->columns;
                indices_2[0] = indices_2[0] + 1) {
              if ((local_1f1 & 1) == 0) {
                CompilerGLSL::to_expression_abi_cxx11_
                          (&local_378,&this->super_CompilerGLSL,ptr,true);
                ::std::operator+(&local_358,&local_378,".");
                CompilerGLSL::to_member_name_abi_cxx11_
                          (&local_398,&this->super_CompilerGLSL,local_90,local_64);
                ::std::operator+(&local_338,&local_358,&local_398);
                ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_338);
                ::std::__cxx11::string::~string((string *)&local_338);
                ::std::__cxx11::string::~string((string *)&local_398);
                ::std::__cxx11::string::~string((string *)&local_358);
                ::std::__cxx11::string::~string((string *)&local_378);
              }
              else {
                meta_2.need_transpose = (bool)(undefined1)local_244;
                meta_2.storage_is_packed = (bool)local_244._1_1_;
                meta_2.storage_is_invariant = (bool)local_244._2_1_;
                meta_2.flattened_struct = (bool)local_244._3_1_;
                meta_2.relaxed_precision = (bool)(undefined1)local_64;
                meta_2.access_meshlet_position_y = (bool)local_64._1_1_;
                meta_2._10_2_ = local_64._2_2_;
                AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_2f8);
                uVar3 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&this->stage_in_ptr_var_id);
                CompilerGLSL::access_chain_internal_abi_cxx11_
                          (&local_318,&this->super_CompilerGLSL,uVar3,
                           (uint32_t *)&meta_2.need_transpose,2,5,(AccessChainMeta *)local_2f8);
                ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_318);
                ::std::__cxx11::string::~string((string *)&local_318);
              }
              if (expr_mbr_type->vecsize < local_2a0->vecsize) {
                pcVar9 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                ::std::__cxx11::string::operator+=((string *)local_60,pcVar9);
              }
              if (indices_2[0] + 1 < expr_mbr_type->columns) {
                ::std::__cxx11::string::operator+=((string *)local_60,", ");
              }
              local_64 = local_64 + 1;
            }
            ::std::__cxx11::string::operator+=((string *)local_60,")");
          }
          else {
            bVar1 = Compiler::is_array((Compiler *)this,expr_mbr_type);
            if (bVar1) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&k_1,this,expr_mbr_type,0);
              ::std::operator+(&local_3b8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &k_1,"({ ");
              ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_3b8);
              ::std::__cxx11::string::~string((string *)&local_3b8);
              ::std::__cxx11::string::~string((string *)&k_1);
              uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,expr_mbr_type,0)
              ;
              for (indices_3[0] = 0; indices_3[0] < uVar3; indices_3[0] = indices_3[0] + 1) {
                if ((local_1f1 & 1) == 0) {
                  CompilerGLSL::to_expression_abi_cxx11_
                            (&local_478,&this->super_CompilerGLSL,ptr,true);
                  ::std::operator+(&local_458,&local_478,".");
                  CompilerGLSL::to_member_name_abi_cxx11_
                            ((string *)indices_4,&this->super_CompilerGLSL,local_90,local_64);
                  ::std::operator+(&local_438,&local_458,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)indices_4);
                  ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_438);
                  ::std::__cxx11::string::~string((string *)&local_438);
                  ::std::__cxx11::string::~string((string *)indices_4);
                  ::std::__cxx11::string::~string((string *)&local_458);
                  ::std::__cxx11::string::~string((string *)&local_478);
                }
                else {
                  meta_3.need_transpose = (bool)(undefined1)local_244;
                  meta_3.storage_is_packed = (bool)local_244._1_1_;
                  meta_3.storage_is_invariant = (bool)local_244._2_1_;
                  meta_3.flattened_struct = (bool)local_244._3_1_;
                  meta_3.relaxed_precision = (bool)(undefined1)local_64;
                  meta_3.access_meshlet_position_y = (bool)local_64._1_1_;
                  meta_3._10_2_ = local_64._2_2_;
                  AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_3f4);
                  uVar4 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&this->stage_in_ptr_var_id);
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (&local_418,&this->super_CompilerGLSL,uVar4,
                             (uint32_t *)&meta_3.need_transpose,2,5,(AccessChainMeta *)local_3f4);
                  ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_418);
                  ::std::__cxx11::string::~string((string *)&local_418);
                }
                if (expr_mbr_type->vecsize < local_2a0->vecsize) {
                  pcVar9 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                  ::std::__cxx11::string::operator+=((string *)local_60,pcVar9);
                }
                if (indices_3[0] + 1 < uVar3) {
                  ::std::__cxx11::string::operator+=((string *)local_60,", ");
                }
                local_64 = local_64 + 1;
              }
              ::std::__cxx11::string::operator+=((string *)local_60," })");
            }
            else {
              if ((local_1f1 & 1) == 0) {
                CompilerGLSL::to_expression_abi_cxx11_
                          (&local_530,&this->super_CompilerGLSL,ptr,true);
                ::std::operator+(&local_510,&local_530,".");
                CompilerGLSL::to_member_name_abi_cxx11_
                          ((string *)&base_interface_index_1,&this->super_CompilerGLSL,local_90,
                           local_64);
                ::std::operator+(&local_4f0,&local_510,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&base_interface_index_1);
                ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_4f0);
                ::std::__cxx11::string::~string((string *)&local_4f0);
                ::std::__cxx11::string::~string((string *)&base_interface_index_1);
                ::std::__cxx11::string::~string((string *)&local_510);
                ::std::__cxx11::string::~string((string *)&local_530);
              }
              else {
                meta_4.need_transpose = (bool)(undefined1)local_244;
                meta_4.storage_is_packed = (bool)local_244._1_1_;
                meta_4.storage_is_invariant = (bool)local_244._2_1_;
                meta_4.flattened_struct = (bool)local_244._3_1_;
                meta_4.relaxed_precision = (bool)(undefined1)local_64;
                meta_4.access_meshlet_position_y = (bool)local_64._1_1_;
                meta_4._10_2_ = local_64._2_2_;
                AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_4ac);
                uVar3 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&this->stage_in_ptr_var_id);
                CompilerGLSL::access_chain_internal_abi_cxx11_
                          (&local_4d0,&this->super_CompilerGLSL,uVar3,
                           (uint32_t *)&meta_4.need_transpose,2,5,(AccessChainMeta *)local_4ac);
                ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_4d0);
                ::std::__cxx11::string::~string((string *)&local_4d0);
              }
              if (expr_mbr_type->vecsize < local_2a0->vecsize) {
                pcVar9 = CompilerGLSL::vector_swizzle(expr_mbr_type->vecsize,0);
                ::std::__cxx11::string::operator+=((string *)local_60,pcVar9);
              }
            }
          }
          uVar5 = mbr_type._4_4_ + 1;
          sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(pSStack_240->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
          if (uVar5 < sVar7) {
            ::std::__cxx11::string::operator+=((string *)local_60,", ");
          }
        }
        ::std::__cxx11::string::operator+=((string *)local_60," }");
        if (local_244 + 1 < local_1f8) {
          ::std::__cxx11::string::operator+=((string *)local_60,", ");
        }
      }
      if ((local_1f1 & 1) != 0) {
        ::std::__cxx11::string::operator+=((string *)local_60," })");
      }
    }
    else {
      bVar1 = Compiler::is_matrix((Compiler *)this,local_900);
      if (bVar1) {
        num_control_points_3._3_1_ = Compiler::is_array((Compiler *)this,local_900);
        if (((bool)num_control_points_3._3_1_) && ((expr.field_2._M_local_buf[0xb] & 1U) == 0)) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar8,
                     "Loading array of matrix from IO variable must come directly from IO variable."
                    );
          __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (local_64 == 0xffffffff) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar8,"Interface index is unknown. Cannot continue.");
          __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((bool)num_control_points_3._3_1_) {
          local_558 = local_64;
          local_55c = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_900,0);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&matrix_type,this,local_900,0);
          ::std::operator+(&local_580,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &matrix_type,"({ ");
          ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_580);
          ::std::__cxx11::string::~string((string *)&local_580);
          ::std::__cxx11::string::~string((string *)&matrix_type);
          var_00 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,ptr);
          pSStack_5a8 = Compiler::get_variable_element_type((Compiler *)this,var_00);
          for (local_5ac = 0; local_5ac < local_55c; local_5ac = local_5ac + 1) {
            local_64 = local_558;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (indices_5 + 1,this,pSStack_5a8,0);
            ::std::operator+(&local_5d0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (indices_5 + 1),"(");
            ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_5d0);
            ::std::__cxx11::string::~string((string *)&local_5d0);
            ::std::__cxx11::string::~string((string *)(indices_5 + 1));
            for (indices_5[0] = 0; indices_5[0] < local_900->columns;
                indices_5[0] = indices_5[0] + 1) {
              meta_5.need_transpose = (bool)(undefined1)local_5ac;
              meta_5.storage_is_packed = (bool)local_5ac._1_1_;
              meta_5.storage_is_invariant = (bool)local_5ac._2_1_;
              meta_5.flattened_struct = (bool)local_5ac._3_1_;
              meta_5.relaxed_precision = (bool)(undefined1)local_64;
              meta_5.access_meshlet_position_y = (bool)local_64._1_1_;
              meta_5._10_2_ = local_64._2_2_;
              AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_608);
              uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
              CompilerGLSL::access_chain_internal_abi_cxx11_
                        (&local_628,&this->super_CompilerGLSL,uVar3,
                         (uint32_t *)&meta_5.need_transpose,2,5,(AccessChainMeta *)local_608);
              ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_628);
              ::std::__cxx11::string::~string((string *)&local_628);
              if (local_900->vecsize < iface_type->vecsize) {
                pcVar9 = CompilerGLSL::vector_swizzle(local_900->vecsize,0);
                ::std::__cxx11::string::operator+=((string *)local_60,pcVar9);
              }
              if (indices_5[0] + 1 < local_900->columns) {
                ::std::__cxx11::string::operator+=((string *)local_60,", ");
              }
              local_64 = local_64 + 1;
            }
            ::std::__cxx11::string::operator+=((string *)local_60,")");
            if (local_5ac + 1 < local_55c) {
              ::std::__cxx11::string::operator+=((string *)local_60,", ");
            }
          }
          ::std::__cxx11::string::operator+=((string *)local_60," })");
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_668,this,local_900,0);
          ::std::operator+(&local_648,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_668,"(");
          ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_648);
          ::std::__cxx11::string::~string((string *)&local_648);
          ::std::__cxx11::string::~string((string *)local_668);
          for (local_66c = 0; local_66c < local_900->columns; local_66c = local_66c + 1) {
            CompilerGLSL::to_expression_abi_cxx11_(&local_6d0,&this->super_CompilerGLSL,ptr,true);
            ::std::operator+(&local_6b0,&local_6d0,".");
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_6f0,&this->super_CompilerGLSL,local_90,local_64);
            ::std::operator+(&local_690,&local_6b0,&local_6f0);
            ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_690);
            ::std::__cxx11::string::~string((string *)&local_690);
            ::std::__cxx11::string::~string((string *)&local_6f0);
            ::std::__cxx11::string::~string((string *)&local_6b0);
            ::std::__cxx11::string::~string((string *)&local_6d0);
            if (local_900->vecsize < iface_type->vecsize) {
              pcVar9 = CompilerGLSL::vector_swizzle(local_900->vecsize,0);
              ::std::__cxx11::string::operator+=((string *)local_60,pcVar9);
            }
            if (local_66c + 1 < local_900->columns) {
              ::std::__cxx11::string::operator+=((string *)local_60,", ");
            }
            local_64 = local_64 + 1;
          }
          ::std::__cxx11::string::operator+=((string *)local_60,")");
        }
      }
      else if ((expr.field_2._M_local_buf[0xb] & 1U) == 0) {
        bVar1 = Compiler::is_array((Compiler *)this,local_900);
        if (!bVar1) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2025,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        sVar7 = VectorView<unsigned_int>::size(&(local_900->array).super_VectorView<unsigned_int>);
        if (sVar7 != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2026,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if (local_64 == 0xffffffff) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar8,"Interface index is unknown. Cannot continue.");
          __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&i_6,this,local_900,0);
        ::std::operator+(&local_790,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_6,
                         "({ ");
        ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_790);
        ::std::__cxx11::string::~string((string *)&local_790);
        ::std::__cxx11::string::~string((string *)&i_6);
        local_7b4 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_900,0);
        for (local_7b8 = 0; local_7b8 < local_7b4; local_7b8 = local_7b8 + 1) {
          CompilerGLSL::to_expression_abi_cxx11_(&local_818,&this->super_CompilerGLSL,ptr,true);
          ::std::operator+(&local_7f8,&local_818,".");
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&local_838,&this->super_CompilerGLSL,local_90,local_64);
          ::std::operator+(&local_7d8,&local_7f8,&local_838);
          ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_7d8);
          ::std::__cxx11::string::~string((string *)&local_7d8);
          ::std::__cxx11::string::~string((string *)&local_838);
          ::std::__cxx11::string::~string((string *)&local_7f8);
          ::std::__cxx11::string::~string((string *)&local_818);
          if (local_900->vecsize < iface_type->vecsize) {
            pcVar9 = CompilerGLSL::vector_swizzle(local_900->vecsize,0);
            ::std::__cxx11::string::operator+=((string *)local_60,pcVar9);
          }
          if (local_7b8 + 1 < local_7b4) {
            ::std::__cxx11::string::operator+=((string *)local_60,", ");
          }
          local_64 = local_64 + 1;
        }
        ::std::__cxx11::string::operator+=((string *)local_60," })");
      }
      else {
        bVar1 = Compiler::is_array((Compiler *)this,local_900);
        if (!bVar1) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2009,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        sVar7 = VectorView<unsigned_int>::size(&(local_900->array).super_VectorView<unsigned_int>);
        if (sVar7 != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x200a,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if (local_64 == 0xffffffff) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar8,"Interface index is unknown. Cannot continue.");
          __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&i_5,this,local_900,0);
        ::std::operator+(&local_710,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5,
                         "({ ");
        ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_710);
        ::std::__cxx11::string::~string((string *)&local_710);
        ::std::__cxx11::string::~string((string *)&i_5);
        uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_900,0);
        for (indices_6[0] = 0; indices_6[0] < uVar3; indices_6[0] = indices_6[0] + 1) {
          meta_6.need_transpose = (bool)(undefined1)indices_6[0];
          meta_6.storage_is_packed = (bool)indices_6[0]._1_1_;
          meta_6.storage_is_invariant = (bool)indices_6[0]._2_1_;
          meta_6.flattened_struct = (bool)indices_6[0]._3_1_;
          meta_6.relaxed_precision = (bool)(undefined1)local_64;
          meta_6.access_meshlet_position_y = (bool)local_64._1_1_;
          meta_6._10_2_ = local_64._2_2_;
          AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_74c);
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
          CompilerGLSL::access_chain_internal_abi_cxx11_
                    (&local_770,&this->super_CompilerGLSL,uVar4,(uint32_t *)&meta_6.need_transpose,2
                     ,5,(AccessChainMeta *)local_74c);
          ::std::__cxx11::string::operator+=((string *)local_60,(string *)&local_770);
          ::std::__cxx11::string::~string((string *)&local_770);
          if (local_900->vecsize < iface_type->vecsize) {
            pcVar9 = CompilerGLSL::vector_swizzle(local_900->vecsize,0);
            ::std::__cxx11::string::operator+=((string *)local_60,pcVar9);
          }
          if (indices_6[0] + 1 < uVar3) {
            ::std::__cxx11::string::operator+=((string *)local_60,", ");
          }
        }
        ::std::__cxx11::string::operator+=((string *)local_60," })");
      }
    }
  }
  CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type_id,id,(string *)local_60,false,false);
  Compiler::register_read((Compiler *)this,id,ptr,false);
  this_local._7_1_ = true;
LAB_00287132:
  local_94 = 1;
  ::std::__cxx11::string::~string((string *)local_60);
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && is_tese_shader())
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;

	bool flattened_io = variable_storage_requires_stage_io(ptr_type.storage);

	bool flat_data_type = flattened_io &&
	                      (is_matrix(result_type) || is_array(result_type) || result_type.basetype == SPIRType::Struct);

	// Edge case, even with multi-patch workgroups, we still need to unroll load
	// if we're loading control points directly.
	if (ptr_is_io_variable && is_array(result_type))
		flat_data_type = true;

	if (!flat_data_type)
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (!flattened_io)
	{
		// Simplest case for multi-patch workgroups, just unroll array as-is.
		if (interface_index == uint32_t(-1))
			return false;

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, uint32_t(result_type.array.size()) - 1);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };
			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || is_matrix(result_type))
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			for (uint32_t j = 0; j < array_size; j++, interface_index++)
			{
				const uint32_t indices[2] = { i, interface_index };

				AccessChainMeta meta;
				expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
				                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
				if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					expr_type.vecsize > sub_type.vecsize)
					expr += vector_swizzle(sub_type.vecsize, 0);

				if (j + 1 < array_size)
					expr += ", ";
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.basetype == SPIRType::Struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					for (uint32_t k = 0; k < array_size; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < array_size)
							expr += ", ";
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (is_matrix(result_type))
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}